

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QTableView::timerEvent(QTableView *this,QTimerEvent *event)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  QWidget *this_00;
  bool bVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  LayoutDirection LVar12;
  QScrollBar *pQVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long in_FS_OFFSET;
  Representation RVar17;
  Representation RVar18;
  QRect QVar19;
  Representation local_68;
  Representation RStack_64;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if (*(int *)(event + 0x10) != *(int *)(lVar4 + 0x548)) goto LAB_00597267;
  pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
  iVar7 = QAbstractSlider::maximum(&pQVar13->super_QAbstractSlider);
  lVar14 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                     super_QWidget;
  if (*(int *)(*(long *)(*(long *)(*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                             field_0x8 + 0x580) + 8) + 0x540) == 1) {
    (**(code **)(lVar14 + 0x260))(this);
  }
  else {
    (**(code **)(lVar14 + 0x268))(this);
    QBasicTimer::stop();
  }
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.x2.m_i = -1;
  local_48.y2.m_i = -1;
  lVar14 = *(long *)(*(long *)(lVar4 + 0x2b0) + 0x20);
  uVar1 = *(undefined8 *)(lVar14 + 0x1c);
  uVar2 = *(undefined8 *)(lVar14 + 0x14);
  RVar17.m_i = (int)uVar1 - (int)uVar2;
  RVar18.m_i = (int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20);
  if (*(long *)(lVar4 + 0x650) == lVar4 + 0x650) {
    pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    iVar8 = QAbstractSlider::value(&pQVar13->super_QAbstractSlider);
    QVar19.x2.m_i = local_48.x2.m_i;
    QVar19.y2.m_i = local_48.y2.m_i;
    QVar19.x1.m_i = local_48.x1.m_i;
    QVar19.y1.m_i = local_48.y1.m_i;
    if (iVar8 == iVar7) goto LAB_00597223;
    uVar11 = *(int *)(lVar4 + 0x560) - 1;
    if (-1 < (int)uVar11) {
      lVar14 = (ulong)uVar11 + 1;
      do {
        iVar7 = *(int *)(*(long *)(lVar4 + 0x558) + -4 + lVar14 * 4);
        local_48 = QVar19;
        uVar11 = QHeaderView::sectionViewportPosition
                           (*(QHeaderView **)
                             (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                        super_QFrame.super_QWidget.field_0x8 + 0x580),iVar7);
        LVar12 = QWidget::layoutDirection((QWidget *)this);
        if (LVar12 == RightToLeft) {
          iVar7 = QHeaderView::sectionSize
                            (*(QHeaderView **)
                              (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                         super_QFrame.super_QWidget.field_0x8 + 0x580),iVar7);
          local_58.x1.m_i = 0;
          local_58.y1.m_i = 0;
          local_58.y2.m_i = RVar18.m_i;
          local_58.x2.m_i = iVar7 + uVar11 + -1;
        }
        else {
          local_58.y1.m_i = 0;
          local_58.x1.m_i = uVar11;
          local_58.x2.m_i = RVar17.m_i;
          local_58.y2.m_i = RVar18.m_i;
        }
        QVar19 = (QRect)QRect::operator|(&local_48,&local_58);
        lVar15 = lVar14 + -1;
        bVar5 = 0 < lVar14;
        lVar14 = lVar15;
      } while (lVar15 != 0 && bVar5);
    }
  }
  else {
LAB_00597223:
    auVar6._4_4_ = RVar18.m_i;
    auVar6._0_4_ = RVar17.m_i;
    auVar6._8_8_ = 0;
    QVar19 = (QRect)(auVar6 << 0x40);
  }
  this_00 = *(QWidget **)(lVar4 + 0x2b0);
  local_48 = QVar19;
  local_58 = (QRect)QRect::normalized();
  QWidget::update(this_00,&local_58);
  QList<int>::clear((QList<int> *)(lVar4 + 0x550));
LAB_00597267:
  if (*(int *)(event + 0x10) == *(int *)(lVar4 + 0x54c)) {
    pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar7 = QAbstractSlider::maximum(&pQVar13->super_QAbstractSlider);
    lVar14 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                       super_QWidget;
    if (*(int *)(*(long *)(*(long *)(*(long *)&(this->super_QAbstractItemView).
                                               super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                               field_0x8 + 0x588) + 8) + 0x540) == 1) {
      (**(code **)(lVar14 + 0x260))(this);
    }
    else {
      (**(code **)(lVar14 + 0x268))(this);
      QBasicTimer::stop();
    }
    lVar14 = *(long *)(*(long *)(lVar4 + 0x2b0) + 0x20);
    RVar17.m_i = *(int *)(lVar14 + 0x20) - *(int *)(lVar14 + 0x18);
    uVar16 = RVar17.m_i + 1;
    iVar8 = *(int *)(lVar14 + 0x14);
    iVar3 = *(int *)(lVar14 + 0x1c);
    uVar11 = 0;
    if (*(long *)(lVar4 + 0x650) == lVar4 + 0x650) {
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar9 = QAbstractSlider::value(&pQVar13->super_QAbstractSlider);
      uVar11 = 0;
      if ((iVar9 != iVar7) &&
         (uVar10 = *(int *)(lVar4 + 0x578) - 1, uVar11 = uVar16, -1 < (int)uVar10)) {
        lVar14 = (ulong)uVar10 + 1;
        do {
          uVar16 = QHeaderView::sectionViewportPosition
                             (*(QHeaderView **)
                               (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                          super_QFrame.super_QWidget.field_0x8 + 0x588),
                              *(int *)(*(long *)(lVar4 + 0x570) + -4 + lVar14 * 4));
          if ((int)uVar16 <= (int)uVar11) {
            uVar11 = uVar16;
          }
          lVar15 = lVar14 + -1;
          bVar5 = 0 < lVar14;
          lVar14 = lVar15;
        } while (lVar15 != 0 && bVar5);
      }
    }
    local_48._0_8_ = (ulong)uVar11 << 0x20;
    local_48.y2.m_i = RVar17.m_i;
    local_48.x2.m_i = iVar3 - iVar8;
    QWidget::update(*(QWidget **)(lVar4 + 0x2b0),&local_48);
    QList<int>::clear((QList<int> *)(lVar4 + 0x568));
  }
  QAbstractItemView::timerEvent((QAbstractItemView *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::timerEvent(QTimerEvent *event)
{
    Q_D(QTableView);

    if (event->id() == d->columnResizeTimer.id()) {
        const int oldScrollMax = horizontalScrollBar()->maximum();
        if (horizontalHeader()->d_func()->state != QHeaderViewPrivate::ResizeSection) {
            updateGeometries();
            d->columnResizeTimer.stop();
        } else {
            updateEditorGeometries();
        }

        QRect rect;
        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        if (d->hasSpans() || horizontalScrollBar()->value() == oldScrollMax) {
            rect = QRect(0, 0, viewportWidth, viewportHeight);
        } else {
            for (int i = d->columnsToUpdate.size()-1; i >= 0; --i) {
                int column = d->columnsToUpdate.at(i);
                int x = columnViewportPosition(column);
                if (isRightToLeft())
                    rect |= QRect(0, 0, x + columnWidth(column), viewportHeight);
                else
                    rect |= QRect(x, 0, viewportWidth - x, viewportHeight);
            }
        }

        d->viewport->update(rect.normalized());
        d->columnsToUpdate.clear();
    }

    if (event->id() == d->rowResizeTimer.id()) {
        const int oldScrollMax = verticalScrollBar()->maximum();
        if (verticalHeader()->d_func()->state != QHeaderViewPrivate::ResizeSection) {
            updateGeometries();
            d->rowResizeTimer.stop();
        } else {
            updateEditorGeometries();
        }

        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        int top;
        if (d->hasSpans() || verticalScrollBar()->value() == oldScrollMax) {
            top = 0;
        } else {
            top = viewportHeight;
            for (int i = d->rowsToUpdate.size()-1; i >= 0; --i) {
                int y = rowViewportPosition(d->rowsToUpdate.at(i));
                top = qMin(top, y);
            }
        }

        d->viewport->update(QRect(0, top, viewportWidth, viewportHeight - top));
        d->rowsToUpdate.clear();
    }

    QAbstractItemView::timerEvent(event);
}